

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall HPresolve::setVariablesToBoundForForcingRow(HPresolve *this,int row,bool isLower)

{
  int *piVar1;
  iterator *piVar2;
  double dVar3;
  int j;
  _Elt_pointer pcVar4;
  pointer piVar5;
  bool bVar6;
  ostream *poVar7;
  long *plVar8;
  pointer pdVar9;
  pointer piVar10;
  pointer piVar11;
  undefined7 in_register_00000011;
  ulong uVar12;
  pointer pdVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> bnds;
  allocator_type local_91;
  undefined8 local_90;
  pointer local_88 [3];
  ulong local_70;
  undefined4 local_68;
  int local_64;
  deque<change,std::allocator<change>> *local_60;
  deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
  *local_58;
  double local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_68 = (undefined4)CONCAT71(in_register_00000011,isLower);
  local_64 = row;
  if (0 < this->iPrint) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"PR: Forcing row ",0x10);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,row);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," removed. Following variables too:   nzRow=",0x2b);
    uVar15 = (ulong)row;
    piVar10 = (this->super_HPreData).nzRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_HPreData).nzRow.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2) <= uVar15)
    goto LAB_00143587;
    plVar8 = (long *)std::ostream::operator<<(poVar7,piVar10[uVar15]);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
  }
  uVar14 = (ulong)row;
  piVar10 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar15 = uVar14;
  if (uVar14 < (ulong)((long)(this->super_HPreData).flagRow.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar10 >> 2)) {
    piVar10[uVar14] = 0;
    local_90 = (double)CONCAT44(row,4);
    local_88[0] = (pointer)((ulong)local_88[0] & 0xffffffff00000000);
    pcVar4 = (this->super_HPreData).chng.c.super__Deque_base<change,_std::allocator<change>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pcVar4 == *(_Elt_pointer *)
                   ((long)&(this->super_HPreData).chng.c.
                           super__Deque_base<change,_std::allocator<change>_>._M_impl.
                           super__Deque_impl_data._M_finish + 0x10) + -1) {
      std::deque<change,std::allocator<change>>::_M_push_back_aux<change_const&>
                ((deque<change,std::allocator<change>> *)&(this->super_HPreData).chng,
                 (change *)&local_90);
    }
    else {
      pcVar4->col = 0;
      *(double *)pcVar4 = local_90;
      piVar2 = &(this->super_HPreData).chng.c.super__Deque_base<change,_std::allocator<change>_>.
                _M_impl.super__Deque_impl_data._M_finish;
      piVar2->_M_cur = piVar2->_M_cur + 1;
    }
    piVar10 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar11 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar12 = (long)piVar11 - (long)piVar10 >> 2;
    local_70 = uVar14;
    if ((uVar14 < uVar12) && (uVar16 = (ulong)(row + 1), uVar15 = uVar16, uVar16 < uVar12)) {
      uVar14 = (ulong)piVar10[uVar14];
      local_58 = (deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                  *)&(this->super_HPreData).oldBounds;
      local_60 = (deque<change,std::allocator<change>> *)&(this->super_HPreData).chng;
      do {
        if ((long)piVar10[uVar16] <= (long)uVar14) {
          piVar10 = (this->super_HPreData).nzRow.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar15 = local_70;
          if (local_70 <
              (ulong)((long)(this->super_HPreData).nzRow.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar10 >> 2)) {
            if (piVar10[local_70] == 1) {
              std::__cxx11::list<int,_std::allocator<int>_>::remove
                        (&this->singRow,(char *)&local_64);
            }
            piVar1 = (this->countRemovedRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + 4;
            *piVar1 = *piVar1 + 1;
            return;
          }
          break;
        }
        piVar5 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar15 = uVar14;
        if ((ulong)((long)(this->super_HPreData).ARindex.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar5 >> 2) <= uVar14) break;
        j = piVar5[uVar14];
        uVar12 = (ulong)j;
        piVar5 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar15 = uVar12;
        if ((ulong)((long)(this->super_HPreData).flagCol.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar5 >> 2) <= uVar12) break;
        if (piVar5[uVar12] != 0) {
          pdVar9 = (this->super_HPreData).ARvalue.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar15 = uVar14;
          if ((ulong)((long)(this->super_HPreData).ARvalue.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar9 >> 3) <= uVar14) break;
          dVar3 = pdVar9[uVar14];
          bVar6 = dVar3 <= 0.0;
          if ((char)local_68 != '\0') {
            bVar6 = 0.0 <= dVar3;
          }
          if (bVar6) {
            pdVar9 = (this->super_HPreData).colLower.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar13 = (this->super_HPreData).colLower.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          else {
            pdVar9 = (this->super_HPreData).colUpper.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar13 = (this->super_HPreData).colUpper.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          uVar15 = uVar12;
          if ((ulong)((long)pdVar13 - (long)pdVar9 >> 3) <= uVar12) break;
          local_50 = pdVar9[uVar12];
          setPrimalValue(this,j,local_50);
          pdVar9 = (this->super_HPreData).colCost.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (((ulong)((long)(this->super_HPreData).colCost.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar9 >> 3) <= uVar12) ||
             (pdVar13 = (this->super_HPreData).valueColDual.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
             (ulong)((long)(this->super_HPreData).valueColDual.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar13 >> 3) <= uVar12))
          break;
          pdVar13[uVar12] = pdVar9[uVar12];
          pdVar9 = (this->super_HPreData).colLower.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->super_HPreData).colLower.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar9 >> 3) <= uVar12) break;
          local_90 = pdVar9[uVar12];
          pdVar9 = (this->super_HPreData).colUpper.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->super_HPreData).colUpper.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar9 >> 3) <= uVar12) break;
          local_88[0] = (pointer)pdVar9[uVar12];
          __l._M_len = 2;
          __l._M_array = (iterator)&local_90;
          std::vector<double,_std::allocator<double>_>::vector(&local_48,__l,&local_91);
          local_90._0_4_ = j;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)local_88,&local_48);
          std::
          deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
          ::emplace_back<std::pair<int,std::vector<double,std::allocator<double>>>>
                    (local_58,(pair<int,_std::vector<double,_std::allocator<double>_>_> *)&local_90)
          ;
          if (local_88[0] != (pointer)0x0) {
            operator_delete(local_88[0]);
          }
          local_90 = 1.03753785626662e-322;
          local_88[0] = (pointer)CONCAT44(local_88[0]._4_4_,j);
          pcVar4 = (this->super_HPreData).chng.c.super__Deque_base<change,_std::allocator<change>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (pcVar4 == *(_Elt_pointer *)
                         ((long)&(this->super_HPreData).chng.c.
                                 super__Deque_base<change,_std::allocator<change>_>._M_impl.
                                 super__Deque_impl_data._M_finish + 0x10) + -1) {
            std::deque<change,std::allocator<change>>::_M_push_back_aux<change_const&>
                      (local_60,(change *)&local_90);
          }
          else {
            pcVar4->col = j;
            pcVar4->type = 0x15;
            pcVar4->row = 0;
            piVar2 = &(this->super_HPreData).chng.c.
                      super__Deque_base<change,_std::allocator<change>_>._M_impl.
                      super__Deque_impl_data._M_finish;
            piVar2->_M_cur = piVar2->_M_cur + 1;
          }
          if (0 < this->iPrint) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"PR:      Variable  ",0x13);
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,j);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," := ",4);
            poVar7 = std::ostream::_M_insert<double>(local_50);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
          piVar1 = (this->countRemovedCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + 4;
          *piVar1 = *piVar1 + 1;
          if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          piVar10 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          piVar11 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar14 = uVar14 + 1;
        uVar15 = uVar16;
      } while (uVar16 < (ulong)((long)piVar11 - (long)piVar10 >> 2));
    }
  }
LAB_00143587:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar15);
}

Assistant:

void HPresolve::setVariablesToBoundForForcingRow(const int row, const bool isLower) {
	int k, col;
	if (iPrint > 0)
		cout << "PR: Forcing row " << row
				<< " removed. Following variables too:   nzRow=" << nzRow.at(row)
				<< endl;

	flagRow.at(row) = 0;
	addChange(FORCING_ROW, row, 0);
	k = ARstart.at(row);
	while (k < ARstart.at(row + 1)) {
		col = ARindex.at(k);
		if (flagCol.at(col)) {
			double value;
			if ((ARvalue.at(k) < 0 && isLower)
					|| (ARvalue.at(k) > 0 && !isLower))
				value = colUpper.at(col);
			else
				value = colLower.at(col);

			setPrimalValue(col, value);
			valueColDual.at(col) = colCost.at(col);
			vector<double> bnds({colLower.at(col), colUpper.at(col)});
			oldBounds.push(make_pair(col, bnds));
			addChange(FORCING_ROW_VARIABLE, 0, col);

			if (iPrint > 0)
				cout << "PR:      Variable  " << col << " := " << value << endl;
			countRemovedCols[FORCING_ROW]++;
		}
		++k;
	}

	if (nzRow.at(row) == 1)
		singRow.remove(row);

	countRemovedRows[FORCING_ROW]++;
}